

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_finishset(lua_State *L,TValue *t,TValue *key,TValue *val,TValue *slot)

{
  Table *t_00;
  bool bVar1;
  Table *local_68;
  Table *local_60;
  TValue *io2;
  TValue *io1;
  Table *h;
  TValue *tm;
  TValue *pTStack_30;
  int loop;
  TValue *slot_local;
  TValue *val_local;
  TValue *key_local;
  TValue *t_local;
  lua_State *L_local;
  
  tm._4_4_ = 0;
  pTStack_30 = slot;
  key_local = t;
  while( true ) {
    if (1999 < tm._4_4_) {
      luaG_runerror(L,"\'__newindex\' chain too long; possible loop");
    }
    if (pTStack_30 == (TValue *)0x0) {
      h = (Table *)luaT_gettmbyobj(L,key_local,TM_NEWINDEX);
      if ((h->tt & 0xf) == 0) {
        luaG_typeerror(L,key_local,"index");
      }
    }
    else {
      t_00 = (Table *)(key_local->value_).gc;
      if (t_00->metatable == (Table *)0x0) {
        local_60 = (Table *)0x0;
      }
      else {
        if ((t_00->metatable->flags & 2) == 0) {
          local_68 = (Table *)luaT_gettm(t_00->metatable,TM_NEWINDEX,L->l_G->tmname[1]);
        }
        else {
          local_68 = (Table *)0x0;
        }
        local_60 = local_68;
      }
      h = local_60;
      if (local_60 == (Table *)0x0) {
        luaH_finishset(L,t_00,key,pTStack_30,val);
        t_00->flags = t_00->flags & 0xc0;
        if ((val->tt_ & 0x40) == 0) {
          return;
        }
        if ((t_00->marked & 0x20) == 0) {
          return;
        }
        if ((((val->value_).gc)->marked & 0x18) == 0) {
          return;
        }
        luaC_barrierback_(L,(GCObject *)t_00);
        return;
      }
    }
    if ((h->tt & 0xf) == 6) {
      luaT_callTM(L,(TValue *)h,key_local,key,val);
      return;
    }
    key_local = (TValue *)h;
    if (h->tt == 'E') {
      pTStack_30 = luaH_get((Table *)h->next,key);
      bVar1 = (pTStack_30->tt_ & 0xf) != 0;
    }
    else {
      pTStack_30 = (TValue *)0x0;
      bVar1 = false;
    }
    if (bVar1) break;
    tm._4_4_ = tm._4_4_ + 1;
  }
  pTStack_30->value_ = val->value_;
  pTStack_30->tt_ = val->tt_;
  if ((val->tt_ & 0x40) == 0) {
    return;
  }
  if ((h->next->marked & 0x20) == 0) {
    return;
  }
  if ((((val->value_).gc)->marked & 0x18) == 0) {
    return;
  }
  luaC_barrierback_(L,h->next);
  return;
}

Assistant:

void luaV_finishset (lua_State *L, const TValue *t, TValue *key,
                     TValue *val, const TValue *slot) {
  int loop;  /* counter to avoid infinite loops */
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;  /* '__newindex' metamethod */
    if (slot != NULL) {  /* is 't' a table? */
      Table *h = hvalue(t);  /* save 't' table */
      lua_assert(isempty(slot));  /* slot must be empty */
      tm = fasttm(L, h->metatable, TM_NEWINDEX);  /* get metamethod */
      if (tm == NULL) {  /* no metamethod? */
        luaH_finishset(L, h, key, slot, val);  /* set new value */
        invalidateTMcache(h);
        luaC_barrierback(L, obj2gco(h), val);
        return;
      }
      /* else will try the metamethod */
    }
    else {  /* not a table; check metamethod */
      tm = luaT_gettmbyobj(L, t, TM_NEWINDEX);
      if (l_unlikely(notm(tm)))
        luaG_typeerror(L, t, "index");
    }
    /* try the metamethod */
    if (ttisfunction(tm)) {
      luaT_callTM(L, tm, t, key, val);
      return;
    }
    t = tm;  /* else repeat assignment over 'tm' */
    if (luaV_fastget(L, t, key, slot, luaH_get)) {
      luaV_finishfastset(L, t, slot, val);
      return;  /* done */
    }
    /* else 'return luaV_finishset(L, t, key, val, slot)' (loop) */
  }
  luaG_runerror(L, "'__newindex' chain too long; possible loop");
}